

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall ON_MaterialRef::Read(ON_MaterialRef *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  object_material_source oVar2;
  uint local_50 [2];
  int i;
  undefined1 local_40 [8];
  ON_SimpleArray<ON_MappingChannel> obsolete_mapping_channels;
  int local_20;
  int iStack_1c;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *archive_local;
  ON_MaterialRef *this_local;
  
  _minor_version = archive;
  archive_local = (ON_BinaryArchive *)this;
  Default(this);
  iStack_1c = 0;
  local_20 = 0;
  obsolete_mapping_channels.m_capacity._3_1_ =
       ON_BinaryArchive::BeginRead3dmChunk
                 (_minor_version,0x40008000,&stack0xffffffffffffffe4,&local_20);
  if ((bool)obsolete_mapping_channels.m_capacity._3_1_) {
    obsolete_mapping_channels.m_capacity._3_1_ = iStack_1c == 1;
    if ((bool)obsolete_mapping_channels.m_capacity._3_1_) {
      obsolete_mapping_channels.m_capacity._3_1_ =
           ON_BinaryArchive::ReadUuid(_minor_version,&this->m_plugin_id);
    }
    if ((bool)obsolete_mapping_channels.m_capacity._3_1_ != false) {
      obsolete_mapping_channels.m_capacity._3_1_ =
           ON_BinaryArchive::ReadUuid(_minor_version,&this->m_material_id);
    }
    ON_SimpleArray<ON_MappingChannel>::ON_SimpleArray((ON_SimpleArray<ON_MappingChannel> *)local_40)
    ;
    if ((obsolete_mapping_channels.m_capacity._3_1_ & 1) != 0) {
      obsolete_mapping_channels.m_capacity._3_1_ =
           ON_BinaryArchive::ReadArray(_minor_version,(ON_SimpleArray<ON_MappingChannel> *)local_40)
      ;
    }
    if (0 < local_20) {
      if ((obsolete_mapping_channels.m_capacity._3_1_ & 1) != 0) {
        obsolete_mapping_channels.m_capacity._3_1_ =
             ON_BinaryArchive::ReadUuid(_minor_version,&this->m_material_backface_id);
      }
      local_50[0] = (uint)this->m_material_source;
      if ((obsolete_mapping_channels.m_capacity._3_1_ & 1) != 0) {
        obsolete_mapping_channels.m_capacity._3_1_ =
             ON_BinaryArchive::ReadInt(_minor_version,(ON__INT32 *)local_50);
      }
      if ((obsolete_mapping_channels.m_capacity._3_1_ & 1) != 0) {
        oVar2 = ON::ObjectMaterialSource(local_50[0]);
        this->m_material_source = (uchar)oVar2;
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    if (!bVar1) {
      obsolete_mapping_channels.m_capacity._3_1_ = 0;
    }
    ON_SimpleArray<ON_MappingChannel>::~ON_SimpleArray
              ((ON_SimpleArray<ON_MappingChannel> *)local_40);
  }
  return (bool)(obsolete_mapping_channels.m_capacity._3_1_ & 1);
}

Assistant:

bool ON_MaterialRef::Read( ON_BinaryArchive& archive )
{
  Default();
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk( TCODE_ANONYMOUS_CHUNK, &major_version, &minor_version );
  if (rc)
  {
    rc = (1 == major_version);

    if (rc) rc = archive.ReadUuid( m_plugin_id );
    if (rc) rc = archive.ReadUuid( m_material_id );

    // 23 May 2006 Dale lear
    //   m_mapping_channels[] was removed from ON_MaterialRef.
    //   To keep from breaking the file format, I need to
    //   write a zero as the array length.
    ON_SimpleArray<ON_MappingChannel> obsolete_mapping_channels;
    if (rc) rc = archive.ReadArray( obsolete_mapping_channels );

    if ( minor_version >= 1 )
    {
      if (rc) rc = archive.ReadUuid( m_material_backface_id );
      int i = m_material_source;
      if (rc) rc = archive.ReadInt( &i );
      if (rc) m_material_source = (unsigned char)ON::ObjectMaterialSource(i);
    }

    if ( !archive.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}